

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O0

void arg_log_r(ps_config_t *cmdln,ps_arg_t *defn,int32 doc,int32 lineno)

{
  cmd_ln_val_t *pcVar1;
  char *pcVar2;
  cmd_ln_val_t *vp;
  int32 deflen;
  int32 namelen;
  int32 n;
  int32 i;
  ps_arg_t **pos;
  int32 lineno_local;
  int32 doc_local;
  ps_arg_t *defn_local;
  ps_config_t *cmdln_local;
  
  if (defn != (ps_arg_t *)0x0) {
    pos._0_4_ = lineno;
    pos._4_4_ = doc;
    _lineno_local = defn;
    defn_local = (ps_arg_t *)cmdln;
    deflen = arg_strlen(defn,(int32 *)((long)&vp + 4),(int32 *)&vp);
    vp._4_4_ = vp._4_4_ + 4;
    vp._0_4_ = (uint)vp + 4;
    if ((int32)pos == 0) {
      err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)vp._4_4_,"[NAME]");
    }
    else {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
              ,0xc3,"%-*s",(ulong)vp._4_4_,"[NAME]");
    }
    err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)(uint)vp,"[DEFLT]");
    if (pos._4_4_ == 0) {
      err_msg(ERR_INFO,(char *)0x0,0,"    [VALUE]\n");
    }
    else {
      err_msg(ERR_INFO,(char *)0x0,0,"     [DESCR]\n");
    }
    _n = arg_sort(_lineno_local,deflen);
    for (namelen = 0; namelen < deflen; namelen = namelen + 1) {
      if ((int32)pos == 0) {
        err_msg(ERR_INFO,(char *)0x0,0,"-%-*s",(ulong)vp._4_4_,_n[namelen]->name);
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                ,0xd2,"-%-*s",(ulong)vp._4_4_,_n[namelen]->name);
      }
      if (_n[namelen]->deflt == (char *)0x0) {
        err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)(uint)vp,"");
      }
      else {
        err_msg(ERR_INFO,(char *)0x0,0,"%-*s",(ulong)(uint)vp,_n[namelen]->deflt);
      }
      if (pos._4_4_ == 0) {
        pcVar1 = cmd_ln_access_r((ps_config_t *)defn_local,_n[namelen]->name);
        if (pcVar1 != (cmd_ln_val_t *)0x0) {
          switch(_n[namelen]->type) {
          case 2:
          case 3:
            err_msg(ERR_INFO,(char *)0x0,0,"    %ld",(pcVar1->val).ptr);
            break;
          case 4:
          case 5:
            err_msg(ERR_INFO,(char *)0x0,0,"    %e",(pcVar1->val).ptr);
            break;
          default:
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/cmd_ln.c"
                    ,0xf3,"Unknown argument type: %d\n",(ulong)(uint)_n[namelen]->type);
            break;
          case 8:
          case 9:
            if ((pcVar1->val).ptr != (void *)0x0) {
              err_msg(ERR_INFO,(char *)0x0,0,"    %s",(pcVar1->val).ptr);
            }
            break;
          case 0x10:
          case 0x11:
            pcVar2 = "no";
            if ((pcVar1->val).ptr != (void *)0x0) {
              pcVar2 = "yes";
            }
            err_msg(ERR_INFO,(char *)0x0,0,"    %s",pcVar2);
          }
        }
      }
      else if (_n[namelen]->doc != (char *)0x0) {
        err_msg(ERR_INFO,(char *)0x0,0,"    %s",_n[namelen]->doc);
      }
      err_msg(ERR_INFO,(char *)0x0,0,"\n");
    }
    ckd_free(_n);
    err_msg(ERR_INFO,(char *)0x0,0,"\n");
  }
  return;
}

Assistant:

static void
arg_log_r(ps_config_t *cmdln, const ps_arg_t * defn, int32 doc, int32 lineno)
{
    ps_arg_t const **pos;
    int32 i, n;
    int32 namelen, deflen;
    cmd_ln_val_t const *vp;

    /* No definitions, do nothing. */
    if (defn == NULL)
        return;

    /* Find max lengths of name and default value fields, and #entries in defn */
    n = arg_strlen(defn, &namelen, &deflen);
    namelen += 4;
    deflen += 4;
    if (lineno)
        E_INFO("%-*s", namelen, "[NAME]");
    else
        E_INFOCONT("%-*s", namelen, "[NAME]");
    E_INFOCONT("%-*s", deflen, "[DEFLT]");
    if (doc) {
        E_INFOCONT("     [DESCR]\n");
    }
    else {
        E_INFOCONT("    [VALUE]\n");
    }

    /* Print current configuration, sorted by name */
    pos = arg_sort(defn, n);
    for (i = 0; i < n; i++) {
        if (lineno)
            E_INFO("-%-*s", namelen, pos[i]->name);
        else
            E_INFOCONT("-%-*s", namelen, pos[i]->name);
        if (pos[i]->deflt)
            E_INFOCONT("%-*s", deflen, pos[i]->deflt);
        else
            E_INFOCONT("%-*s", deflen, "");
        if (doc) {
            if (pos[i]->doc)
                E_INFOCONT("    %s", pos[i]->doc);
        }
        else {
            vp = cmd_ln_access_r(cmdln, pos[i]->name);
            if (vp) {
                switch (pos[i]->type) {
                case ARG_INTEGER:
                case REQARG_INTEGER:
                    E_INFOCONT("    %ld", vp->val.i);
                    break;
                case ARG_FLOATING:
                case REQARG_FLOATING:
                    E_INFOCONT("    %e", vp->val.fl);
                    break;
                case ARG_STRING:
                case REQARG_STRING:
                    if (vp->val.ptr)
                        E_INFOCONT("    %s", (char *)vp->val.ptr);
                    break;
                case ARG_BOOLEAN:
                case REQARG_BOOLEAN:
                    E_INFOCONT("    %s", vp->val.i ? "yes" : "no");
                    break;
                default:
                    E_ERROR("Unknown argument type: %d\n", pos[i]->type);
                }
            }
        }

        E_INFOCONT("\n");
    }
    ckd_free(pos);
    E_INFOCONT("\n");
}